

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O1

int Ivy_ManFindBoolCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Ptr_t *vFront,Vec_Ptr_t *vVolume,
                      Vec_Ptr_t *vLeaves)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  Ivy_Obj_t *pIVar6;
  void **ppvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  Ivy_Obj_t *pIVar11;
  Ivy_Obj_t *pIVar12;
  ulong uVar13;
  uint uVar14;
  Ivy_Obj_t *pFanin0;
  Ivy_Obj_t *pFanin1;
  Ivy_Obj_t *local_68;
  Ivy_Obj_t *local_60;
  ulong local_58;
  int local_4c;
  Ivy_Obj_t *local_48;
  Ivy_Man_t *local_40;
  Ivy_Obj_t *local_38;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x135,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  vFront->nSize = 0;
  vVolume->nSize = 0;
  iVar4 = Ivy_ObjIsMuxType(pRoot);
  local_40 = p;
  if (iVar4 == 0) {
    local_68 = (Ivy_Obj_t *)((ulong)pRoot->pFanin0 & 0xfffffffffffffffe);
    local_60 = (Ivy_Obj_t *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe);
    pIVar6 = (Ivy_Obj_t *)0x0;
  }
  else {
    pIVar6 = Ivy_ObjRecognizeMux(pRoot,&local_68,&local_60);
  }
  pIVar11 = local_68;
  *(uint *)&local_68->field_0x8 = *(uint *)&local_68->field_0x8 | 0x10;
  uVar5 = vFront->nCap;
  if (vFront->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vFront->pArray,0x80);
      }
      vFront->pArray = ppvVar7;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar5 * 2;
      if (iVar4 <= (int)uVar5) goto LAB_0091d057;
      if (vFront->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vFront->pArray,(ulong)uVar5 << 4);
      }
      vFront->pArray = ppvVar7;
    }
    vFront->nCap = iVar4;
  }
LAB_0091d057:
  pIVar12 = local_68;
  iVar4 = vFront->nSize;
  vFront->nSize = iVar4 + 1;
  vFront->pArray[iVar4] = pIVar11;
  uVar5 = vVolume->nCap;
  if (vVolume->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vVolume->pArray,0x80);
      }
      vVolume->pArray = ppvVar7;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar5 * 2;
      if (iVar4 <= (int)uVar5) goto LAB_0091d0e3;
      if (vVolume->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vVolume->pArray,(ulong)uVar5 << 4);
      }
      vVolume->pArray = ppvVar7;
    }
    vVolume->nCap = iVar4;
  }
LAB_0091d0e3:
  pIVar11 = local_60;
  iVar4 = vVolume->nSize;
  vVolume->nSize = iVar4 + 1;
  vVolume->pArray[iVar4] = pIVar12;
  *(uint *)&local_60->field_0x8 = *(uint *)&local_60->field_0x8 | 0x20;
  uVar5 = vFront->nCap;
  local_48 = pIVar6;
  if (vFront->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vFront->pArray,0x80);
      }
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar5 * 2;
      if (iVar4 <= (int)uVar5) goto LAB_0091d171;
      if (vFront->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vFront->pArray,(ulong)uVar5 << 4);
      }
    }
    vFront->pArray = ppvVar7;
    vFront->nCap = iVar4;
  }
LAB_0091d171:
  pIVar6 = local_60;
  iVar4 = vFront->nSize;
  vFront->nSize = iVar4 + 1;
  vFront->pArray[iVar4] = pIVar11;
  uVar5 = vVolume->nCap;
  if (vVolume->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vVolume->pArray,0x80);
      }
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar5 * 2;
      if (iVar4 <= (int)uVar5) goto LAB_0091d1f2;
      if (vVolume->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vVolume->pArray,(ulong)uVar5 << 4);
      }
    }
    vVolume->pArray = ppvVar7;
    vVolume->nCap = iVar4;
  }
LAB_0091d1f2:
  iVar4 = vVolume->nSize;
  vVolume->nSize = iVar4 + 1;
  vVolume->pArray[iVar4] = pIVar6;
  uVar5 = *(uint *)&pRoot->field_0x8;
  uVar14 = uVar5 >> 0xb;
  uVar9 = (ulong)pRoot->pFanin0 & 0xfffffffffffffffe;
  uVar13 = (ulong)pRoot->pFanin1 & 0xfffffffffffffffe;
  if (*(uint *)(uVar13 + 8) >> 0xb < *(uint *)(uVar9 + 8) >> 0xb) {
    uVar13 = uVar9;
  }
  local_38 = pRoot;
  if (uVar14 != (*(uint *)(uVar13 + 8) >> 0xb) + (uint)((uVar5 & 0xf) == 6) + 1) {
    __assert_fail("Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x14a,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  local_4c = 1;
  if (0x5fff < uVar5) {
    local_4c = uVar14 - 10;
  }
  pIVar6 = (Ivy_Obj_t *)0x0;
  do {
    if ((int)uVar14 <= local_4c) {
      pIVar11 = (Ivy_Obj_t *)0x0;
      break;
    }
    uVar13 = (ulong)uVar14;
    uVar14 = uVar14 - 1;
    local_58 = uVar13;
    do {
      uVar5 = vFront->nSize;
      if ((int)uVar5 < 1) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          pIVar6 = (Ivy_Obj_t *)vFront->pArray[uVar9];
          if (*(uint *)&pIVar6->field_0x8 >> 0xb == uVar14) goto LAB_0091d2b6;
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
        uVar9 = (ulong)uVar5;
      }
LAB_0091d2b6:
      if ((uint)uVar9 == uVar5) {
        pIVar11 = (Ivy_Obj_t *)0x0;
        break;
      }
      uVar2 = *(uint *)&pIVar6->field_0x8;
      if ((int)uVar13 <= (int)(uVar2 >> 0xb)) {
        __assert_fail("(int)pObj->Level <= Lev",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                      ,0x157,
                      "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      if (((uVar2 >> 5 ^ uVar2 >> 4) & 1) == 0) {
        __assert_fail("pObj->fMarkA ^ pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                      ,0x158,
                      "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      lVar8 = (ulong)uVar5 + 1;
      do {
        if ((int)lVar8 + -1 < 1) goto LAB_0091daa2;
        lVar10 = lVar8 + -1;
        lVar3 = lVar8 + -2;
        lVar8 = lVar10;
      } while ((Ivy_Obj_t *)vFront->pArray[lVar3] != pIVar6);
      for (; (int)lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
        vFront->pArray[lVar10 + -1] = vFront->pArray[lVar10];
      }
      vFront->nSize = uVar5 - 1;
      pIVar11 = (Ivy_Obj_t *)((ulong)pIVar6->pFanin0 & 0xfffffffffffffffe);
      local_68 = pIVar11;
      if ((pIVar11->field_0x8 & 0x30) == 0) {
        uVar2 = vFront->nCap;
        if (uVar5 - 1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vFront->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vFront->pArray,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_0091d3a3;
            if (vFront->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(vFront->pArray,(ulong)uVar2 << 4);
            }
          }
          vFront->pArray = ppvVar7;
          vFront->nCap = iVar4;
          uVar13 = local_58;
        }
LAB_0091d3a3:
        pIVar12 = local_68;
        iVar4 = vFront->nSize;
        vFront->nSize = iVar4 + 1;
        vFront->pArray[iVar4] = pIVar11;
        uVar5 = vVolume->nCap;
        if (vVolume->nSize == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (vVolume->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vVolume->pArray,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar5 * 2;
            if (iVar4 <= (int)uVar5) goto LAB_0091d425;
            if (vVolume->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(vVolume->pArray,(ulong)uVar5 << 4);
            }
          }
          vVolume->pArray = ppvVar7;
          vVolume->nCap = iVar4;
          uVar13 = local_58;
        }
LAB_0091d425:
        iVar4 = vVolume->nSize;
        vVolume->nSize = iVar4 + 1;
        vVolume->pArray[iVar4] = pIVar12;
      }
      if ((pIVar6->field_0x8 & 0x10) != 0) {
        *(uint *)&local_68->field_0x8 = *(uint *)&local_68->field_0x8 | 0x10;
      }
      if ((pIVar6->field_0x8 & 0x20) != 0) {
        *(uint *)&local_68->field_0x8 = *(uint *)&local_68->field_0x8 | 0x20;
      }
      pIVar12 = local_68;
      if ((*(uint *)&pIVar6->field_0x8 & 0xf) != 7) {
        pIVar11 = (Ivy_Obj_t *)((ulong)pIVar6->pFanin1 & 0xfffffffffffffffe);
        local_60 = pIVar11;
        if ((pIVar11->field_0x8 & 0x30) == 0) {
          uVar5 = vFront->nCap;
          if (vFront->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (vFront->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vFront->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar5 * 2;
              if (iVar4 <= (int)uVar5) goto LAB_0091d50c;
              if (vFront->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(vFront->pArray,(ulong)uVar5 << 4);
              }
            }
            vFront->pArray = ppvVar7;
            vFront->nCap = iVar4;
            uVar13 = local_58;
          }
LAB_0091d50c:
          pIVar12 = local_60;
          iVar4 = vFront->nSize;
          vFront->nSize = iVar4 + 1;
          vFront->pArray[iVar4] = pIVar11;
          uVar5 = vVolume->nCap;
          if (vVolume->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (vVolume->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vVolume->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar5 * 2;
              if (iVar4 <= (int)uVar5) goto LAB_0091d58e;
              if (vVolume->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(vVolume->pArray,(ulong)uVar5 << 4);
              }
            }
            vVolume->pArray = ppvVar7;
            vVolume->nCap = iVar4;
            uVar13 = local_58;
          }
LAB_0091d58e:
          iVar4 = vVolume->nSize;
          vVolume->nSize = iVar4 + 1;
          vVolume->pArray[iVar4] = pIVar12;
        }
        if ((pIVar6->field_0x8 & 0x10) != 0) {
          *(uint *)&local_60->field_0x8 = *(uint *)&local_60->field_0x8 | 0x10;
        }
        if ((pIVar6->field_0x8 & 0x20) != 0) {
          *(uint *)&local_60->field_0x8 = *(uint *)&local_60->field_0x8 | 0x20;
        }
        pIVar12 = local_60;
        pIVar11 = local_68;
        if ((~*(uint *)&local_68->field_0x8 & 0x30) == 0) break;
      }
      pIVar11 = pIVar12;
    } while ((~*(uint *)&pIVar12->field_0x8 & 0x30) != 0);
  } while (pIVar11 == (Ivy_Obj_t *)0x0);
  pIVar12 = local_48;
  if (pIVar11 == (Ivy_Obj_t *)0x0) {
    return 0;
  }
  if ((local_48 == (Ivy_Obj_t *)0x0) || ((local_48->field_0x8 & 0x30) != 0)) goto LAB_0091d6c6;
  uVar5 = vFront->nCap;
  if (vFront->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vFront->pArray,0x80);
      }
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar5 * 2;
      if (iVar4 <= (int)uVar5) goto LAB_0091d6b0;
      if (vFront->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vFront->pArray,(ulong)uVar5 << 4);
      }
    }
    vFront->pArray = ppvVar7;
    vFront->nCap = iVar4;
  }
LAB_0091d6b0:
  iVar4 = vFront->nSize;
  vFront->nSize = iVar4 + 1;
  vFront->pArray[iVar4] = pIVar12;
LAB_0091d6c6:
  if (0 < vVolume->nSize) {
    lVar8 = 0;
    do {
      pIVar6 = (Ivy_Obj_t *)vVolume->pArray[lVar8];
      *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 & 0xffffffcf;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vVolume->nSize);
  }
  if (0 < vFront->nSize) {
    lVar8 = 0;
    do {
      pIVar6 = (Ivy_Obj_t *)vFront->pArray[lVar8];
      *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 | 0x10;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vFront->nSize);
  }
  vLeaves->nSize = 0;
  vVolume->nSize = 0;
  iVar4 = Ivy_ManFindBoolCut_rec(local_40,local_38,vLeaves,vVolume,pIVar11);
  if (iVar4 == 0) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x19f,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (0 < vFront->nSize) {
    lVar8 = 0;
    do {
      pIVar6 = (Ivy_Obj_t *)vFront->pArray[lVar8];
      *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 & 0xffffffef;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vFront->nSize);
  }
  if (0 < vVolume->nSize) {
    lVar8 = 0;
    do {
      pIVar6 = (Ivy_Obj_t *)vVolume->pArray[lVar8];
      *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 | 0x10;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vVolume->nSize);
  }
  do {
    do {
      do {
        uVar5 = 0;
        if (0 < vLeaves->nSize) {
          lVar8 = 0;
          do {
            pIVar6 = (Ivy_Obj_t *)vLeaves->pArray[lVar8];
            uVar5 = Ivy_ManFindBoolCutCost(pIVar6);
            if (uVar5 < 2) break;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vLeaves->nSize);
          uVar5 = (uint)lVar8;
        }
        uVar14 = vLeaves->nSize;
        if (uVar5 == uVar14) {
          if (vVolume->nSize < 1) {
            return 1;
          }
          lVar8 = 0;
          do {
            puVar1 = (uint *)((long)vVolume->pArray[lVar8] + 8);
            *puVar1 = *puVar1 & 0xffffffef;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vVolume->nSize);
          return 1;
        }
        lVar8 = (ulong)uVar14 + 1;
        do {
          if ((int)lVar8 + -1 < 1) {
LAB_0091daa2:
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
          }
          lVar10 = lVar8 + -1;
          lVar3 = lVar8 + -2;
          lVar8 = lVar10;
        } while ((Ivy_Obj_t *)vLeaves->pArray[lVar3] != pIVar6);
        for (; (int)lVar10 < (int)uVar14; lVar10 = lVar10 + 1) {
          vLeaves->pArray[lVar10 + -1] = vLeaves->pArray[lVar10];
        }
        vLeaves->nSize = uVar14 - 1;
        pIVar11 = (Ivy_Obj_t *)((ulong)pIVar6->pFanin0 & 0xfffffffffffffffe);
        local_68 = pIVar11;
        if ((*(uint *)&pIVar11->field_0x8 & 0x10) == 0) {
          *(uint *)&pIVar11->field_0x8 = *(uint *)&pIVar11->field_0x8 | 0x10;
          uVar5 = vVolume->nCap;
          if (vVolume->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (vVolume->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vVolume->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar5 * 2;
              if (iVar4 <= (int)uVar5) goto LAB_0091d849;
              if (vVolume->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(vVolume->pArray,(ulong)uVar5 << 4);
              }
            }
            vVolume->pArray = ppvVar7;
            vVolume->nCap = iVar4;
          }
LAB_0091d849:
          pIVar12 = local_68;
          iVar4 = vVolume->nSize;
          vVolume->nSize = iVar4 + 1;
          vVolume->pArray[iVar4] = pIVar11;
          uVar5 = vLeaves->nCap;
          if (vLeaves->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (vLeaves->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vLeaves->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar5 * 2;
              if (iVar4 <= (int)uVar5) goto LAB_0091d8c2;
              if (vLeaves->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(vLeaves->pArray,(ulong)uVar5 << 4);
              }
            }
            vLeaves->pArray = ppvVar7;
            vLeaves->nCap = iVar4;
          }
LAB_0091d8c2:
          iVar4 = vLeaves->nSize;
          vLeaves->nSize = iVar4 + 1;
          vLeaves->pArray[iVar4] = pIVar12;
        }
      } while ((*(uint *)&pIVar6->field_0x8 & 0xf) == 7);
      pIVar11 = (Ivy_Obj_t *)((ulong)pIVar6->pFanin1 & 0xfffffffffffffffe);
      local_60 = pIVar11;
    } while ((*(uint *)&pIVar11->field_0x8 & 0x10) != 0);
    *(uint *)&pIVar11->field_0x8 = *(uint *)&pIVar11->field_0x8 | 0x10;
    uVar5 = vVolume->nCap;
    if (vVolume->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vVolume->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vVolume->pArray,0x80);
        }
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar5 * 2;
        if (iVar4 <= (int)uVar5) goto LAB_0091d980;
        if (vVolume->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(vVolume->pArray,(ulong)uVar5 << 4);
        }
      }
      vVolume->pArray = ppvVar7;
      vVolume->nCap = iVar4;
    }
LAB_0091d980:
    pIVar12 = local_60;
    iVar4 = vVolume->nSize;
    vVolume->nSize = iVar4 + 1;
    vVolume->pArray[iVar4] = pIVar11;
    uVar5 = vLeaves->nCap;
    if (vLeaves->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vLeaves->pArray,0x80);
        }
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar5 * 2;
        if (iVar4 <= (int)uVar5) goto LAB_0091d9f5;
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(vLeaves->pArray,(ulong)uVar5 << 4);
        }
      }
      vLeaves->pArray = ppvVar7;
      vLeaves->nCap = iVar4;
    }
LAB_0091d9f5:
    iVar4 = vLeaves->nSize;
    vLeaves->nSize = iVar4 + 1;
    vLeaves->pArray[iVar4] = pIVar12;
  } while( true );
}

Assistant:

int Ivy_ManFindBoolCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Ptr_t * vFront, Vec_Ptr_t * vVolume, Vec_Ptr_t * vLeaves )
{
    Ivy_Obj_t * pObj = NULL; // Suppress "might be used uninitialized"
    Ivy_Obj_t * pFaninC, * pFanin0, * pFanin1, * pPivot;
    int RetValue, LevelLimit, Lev, k;
    assert( !Ivy_IsComplement(pRoot) );
    // clear the frontier and collect the nodes
    Vec_PtrClear( vFront );
    Vec_PtrClear( vVolume );
    if ( Ivy_ObjIsMuxType(pRoot) )
        pFaninC = Ivy_ObjRecognizeMux( pRoot, &pFanin0, &pFanin1 );
    else
    {
        pFaninC = NULL;
        pFanin0 = Ivy_ObjFanin0(pRoot);
        pFanin1 = Ivy_ObjFanin1(pRoot); 
    }
    // start cone A
    pFanin0->fMarkA = 1;
    Vec_PtrPush( vFront, pFanin0 );
    Vec_PtrPush( vVolume, pFanin0 );
    // start cone B
    pFanin1->fMarkB = 1;
    Vec_PtrPush( vFront, pFanin1 );
    Vec_PtrPush( vVolume, pFanin1 );
    // iteratively expand until the common node (pPivot) is found or limit is reached
    assert( Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot) );
    pPivot = NULL;
    LevelLimit = IVY_MAX( Ivy_ObjLevel(pRoot) - 10, 1 );
    for ( Lev = Ivy_ObjLevel(pRoot) - 1; Lev >= LevelLimit; Lev-- )
    {
        while ( 1 )
        {
            // find the next node to expand on this level
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
                if ( (int)pObj->Level == Lev )
                    break;
            if ( k == Vec_PtrSize(vFront) )
                break;
            assert( (int)pObj->Level <= Lev );
            assert( pObj->fMarkA ^ pObj->fMarkB );
            // remove the old node
            Vec_PtrRemove( vFront, pObj );

            // expand this node
            pFanin0 = Ivy_ObjFanin0(pObj);
            if ( !pFanin0->fMarkA && !pFanin0->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin0 );
                Vec_PtrPush( vVolume, pFanin0 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin0->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin0->fMarkB = 1; 

            if ( Ivy_ObjIsBuf(pObj) )
            {
                if ( pFanin0->fMarkA && pFanin0->fMarkB )
                {
                    pPivot = pFanin0;
                    break;
                }
                continue;
            }

            // expand this node
            pFanin1 = Ivy_ObjFanin1(pObj); 
            if ( !pFanin1->fMarkA && !pFanin1->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin1 );
                Vec_PtrPush( vVolume, pFanin1 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin1->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin1->fMarkB = 1; 

            // consider if it is time to quit
            if ( pFanin0->fMarkA && pFanin0->fMarkB )
            {
                pPivot = pFanin0;
                break;
            }
            if ( pFanin1->fMarkA && pFanin1->fMarkB )
            {
                pPivot = pFanin1;
                break;
            }
        }
        if ( pPivot != NULL )
            break;
    }
    if ( pPivot == NULL )
        return 0;
    // if the MUX control is defined, it should not be
    if ( pFaninC && !pFaninC->fMarkA && !pFaninC->fMarkB )
        Vec_PtrPush( vFront, pFaninC );
    // clean the markings
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = pObj->fMarkB = 0;

    // mark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 1;
    // cut exists, collect all the nodes on the shortest path to the pivot
    Vec_PtrClear( vLeaves );
    Vec_PtrClear( vVolume );
    RetValue = Ivy_ManFindBoolCut_rec( p, pRoot, vLeaves, vVolume, pPivot );
    assert( RetValue == 1 );
    // unmark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 0;

    // mark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 1;
    // expand the cut without increasing its size
    while ( 1 )
    {
        Vec_PtrForEachEntry( Ivy_Obj_t *, vLeaves, pObj, k )
            if ( Ivy_ManFindBoolCutCost(pObj) < 2 )
                break;
        if ( k == Vec_PtrSize(vLeaves) )
            break;
        // the node can be expanded
        // remove the old node
        Vec_PtrRemove( vLeaves, pObj );
        // expand this node
        pFanin0 = Ivy_ObjFanin0(pObj);
        if ( !pFanin0->fMarkA )
        {
            pFanin0->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin0 );
            Vec_PtrPush( vLeaves, pFanin0 );
        }
        if ( Ivy_ObjIsBuf(pObj) )
            continue;
        // expand this node
        pFanin1 = Ivy_ObjFanin1(pObj);
        if ( !pFanin1->fMarkA )
        {
            pFanin1->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin1 );
            Vec_PtrPush( vLeaves, pFanin1 );
        }        
    }
    // unmark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 0;
    return 1;
}